

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_half(secp256k1_fe *r)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  secp256k1_ge *a;
  secp256k1_ge *a_00;
  secp256k1_ge *psVar7;
  secp256k1_fe *a_01;
  secp256k1_ge *psVar8;
  secp256k1_ge *r_00;
  secp256k1_ge *a_02;
  undefined1 auVar9 [16];
  undefined1 auStack_98 [104];
  secp256k1_ge *psStack_30;
  uint uVar10;
  
  secp256k1_fe_verify(r);
  a_01 = (secp256k1_fe *)(ulong)(uint)r->magnitude;
  secp256k1_fe_verify_magnitude(a_01,0x1f);
  a = (secp256k1_ge *)r->n[0];
  uVar2 = -(ulong)((uint)a & 1);
  uVar4 = uVar2 >> 0xc;
  uVar6 = (long)(a->x).n + (uVar4 & 0xffffefffffc2f);
  if ((uVar6 & 1) == 0) {
    uVar3 = (uVar2 >> 0x10) + r->n[4];
    uVar5 = uVar4 + r->n[3];
    uVar10 = (uint)(uVar2 >> 0x2c);
    auVar9._0_8_ = CONCAT44(uVar10,(int)uVar4);
    auVar9._8_4_ = (int)uVar4;
    auVar9._12_4_ = uVar10;
    uVar2 = auVar9._0_8_ + r->n[1];
    uVar4 = auVar9._8_8_ + r->n[2];
    r->n[0] = ((ulong)((uint)uVar2 & 1) << 0x33) + (uVar6 >> 1);
    r->n[1] = ((uVar4 & 1) << 0x33) + (uVar2 >> 1);
    r->n[2] = ((uVar5 & 1) << 0x33) + (uVar4 >> 1);
    r->n[3] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar5 >> 1);
    r->n[4] = uVar3 >> 1;
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_half_cold_1();
  a_00 = a;
  secp256k1_fe_verify(a_01);
  psVar8 = a;
  secp256k1_fe_verify(&a->x);
  iVar1 = (a->x).magnitude + a_01->magnitude;
  if (iVar1 < 0x21) {
    a_01->n[0] = a_01->n[0] + (a->x).n[0];
    a_01->n[1] = a_01->n[1] + (a->x).n[1];
    a_01->n[2] = a_01->n[2] + (a->x).n[2];
    a_01->n[3] = a_01->n[3] + (a->x).n[3];
    a_01->n[4] = a_01->n[4] + (a->x).n[4];
    a_01->magnitude = iVar1;
    a_01->normalized = 0;
    secp256k1_fe_verify(a_01);
    return;
  }
  secp256k1_fe_add_cold_1();
  a_02 = (secp256k1_ge *)auStack_98;
  psVar7 = a_00;
  r_00 = a_00;
  auStack_98._96_8_ = a_01;
  psStack_30 = a;
  secp256k1_ge_verify(a_00);
  if (a_00->infinity == 0) {
    auStack_98._48_8_ = (a_00->x).n[0];
    auStack_98._56_8_ = (a_00->x).n[1];
    auStack_98._64_8_ = (a_00->x).n[2];
    auStack_98._72_8_ = (a_00->x).n[3];
    auStack_98._80_8_ = (a_00->x).n[4];
    auStack_98._88_4_ = (a_00->x).magnitude;
    auStack_98._92_4_ = (a_00->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_98 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_98._0_8_ = (a_00->y).n[0];
    auStack_98._8_8_ = (a_00->y).n[1];
    auStack_98._16_8_ = (a_00->y).n[2];
    auStack_98._24_8_ = (a_00->y).n[3];
    auStack_98._32_8_ = (a_00->y).n[4];
    auStack_98._40_4_ = (a_00->y).magnitude;
    auStack_98._44_4_ = (a_00->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_98);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (auStack_98._92_4_ != 0) {
      (psVar8->x).n[0] = auStack_98._56_8_ << 0x34 | auStack_98._48_8_;
      (psVar8->x).n[1] = auStack_98._64_8_ << 0x28 | (ulong)auStack_98._56_8_ >> 0xc;
      (psVar8->x).n[2] = auStack_98._72_8_ << 0x1c | (ulong)auStack_98._64_8_ >> 0x18;
      (psVar8->x).n[3] = auStack_98._80_8_ << 0x10 | (ulong)auStack_98._72_8_ >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_98);
      if (auStack_98._44_4_ != 0) {
        (psVar8->x).n[4] = auStack_98._8_8_ << 0x34 | auStack_98._0_8_;
        uVar2 = auStack_98._16_8_ << 0x28 | (ulong)auStack_98._8_8_ >> 0xc;
        (psVar8->x).magnitude = (int)uVar2;
        (psVar8->x).normalized = (int)(uVar2 >> 0x20);
        (psVar8->y).n[0] = auStack_98._24_8_ << 0x1c | (ulong)auStack_98._16_8_ >> 0x18;
        (psVar8->y).n[1] = auStack_98._32_8_ << 0x10 | (ulong)auStack_98._24_8_ >> 0x24;
        return;
      }
      goto LAB_00116078;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_02 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_00116078:
  secp256k1_ge_to_storage_cold_2();
  (a_02->x).n[0] = (psVar7->x).n[0] & 0xfffffffffffff;
  (a_02->x).n[1] = ((psVar7->x).n[1] & 0xffffffffff) << 0xc | (psVar7->x).n[0] >> 0x34;
  (a_02->x).n[2] = ((psVar7->x).n[2] & 0xfffffff) << 0x18 | (psVar7->x).n[1] >> 0x28;
  (a_02->x).n[3] = ((psVar7->x).n[3] & 0xffff) << 0x24 | (psVar7->x).n[2] >> 0x1c;
  (a_02->x).n[4] = (psVar7->x).n[3] >> 0x10;
  (a_02->x).magnitude = 1;
  (a_02->x).normalized = 1;
  secp256k1_fe_verify(&a_02->x);
  (a_02->y).n[0] = (psVar7->x).n[4] & 0xfffffffffffff;
  uVar2._0_4_ = (psVar7->x).magnitude;
  uVar2._4_4_ = (psVar7->x).normalized;
  (a_02->y).n[1] = (uVar2 & 0xffffffffff) << 0xc | (psVar7->x).n[4] >> 0x34;
  uVar4._0_4_ = (psVar7->x).magnitude;
  uVar4._4_4_ = (psVar7->x).normalized;
  (a_02->y).n[2] = ((psVar7->y).n[0] & 0xfffffff) << 0x18 | uVar4 >> 0x28;
  (a_02->y).n[3] = ((psVar7->y).n[1] & 0xffff) << 0x24 | (psVar7->y).n[0] >> 0x1c;
  (a_02->y).n[4] = (psVar7->y).n[1] >> 0x10;
  (a_02->y).magnitude = 1;
  (a_02->y).normalized = 1;
  secp256k1_fe_verify(&a_02->y);
  a_02->infinity = 0;
  secp256k1_ge_verify(a_02);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_half(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY_MAGNITUDE(r, 31);

    secp256k1_fe_impl_half(r);
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}